

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,TextureCube *resultTexture,TextureCube *level0Reference,
          GenMipmapPrecision *precision)

{
  ostringstream *this;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar1;
  TestLog *imageSetName;
  bool bVar2;
  int iVar3;
  MessageBuilder *this_00;
  GenMipmapPrecision *precision_00;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  uint uVar4;
  ostringstream *poVar5;
  int local_480;
  qpTestResult local_47c;
  allocator<char> local_475;
  allocator<char> local_474;
  allocator<char> local_473;
  allocator<char> local_472;
  allocator<char> local_471;
  Vec4 *local_470;
  uint local_464;
  BVec4 *local_460;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_458;
  GenMipmapPrecision *local_450;
  TextureCube *local_448;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  Surface errorMask;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  Vec4 threshold;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  LogImageSet local_230;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  MessageBuilder local_1b0;
  
  local_470 = &precision->colorThreshold;
  local_460 = &precision->colorMask;
  local_440 = level0Reference->m_access;
  local_458 = resultTexture->m_access;
  local_47c = QP_TEST_RESULT_PASS;
  uVar4 = 0;
  local_450 = precision;
  local_448 = resultTexture;
  while (local_438._M_dataplus._M_p._0_4_ = uVar4, (int)uVar4 < 6) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_1b0,1.0);
    tcu::select<float,4>((tcu *)&threshold,local_470,(Vector<float,_4> *)&local_1b0,local_460);
    de::toString<int>(&local_230.m_name,(int *)&local_438);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   "Level0Face",&local_230.m_name);
    imageSetName = local_1b0.m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dst,"Level 0, face ",(allocator<char> *)&local_390);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dst,
                   compareGenMipmapResult::s_faceNames[uVar4]);
    bVar2 = tcu::floatThresholdCompare
                      (log,(char *)imageSetName,(char *)src.m_format,
                       &(local_440[uVar4].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       &(local_458[uVar4].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       &threshold,COMPARE_LOG_RESULT);
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::~string((string *)&dst);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_230);
    if (!bVar2) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"ERROR: Level 0, face ");
      this_00 = tcu::MessageBuilder::operator<<
                          (&local_1b0,compareGenMipmapResult::s_faceNames + uVar4);
      std::operator<<((ostream *)&this_00->m_str," comparison failed!");
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      local_47c = QP_TEST_RESULT_FAIL;
    }
    uVar4 = (uint)local_438._M_dataplus._M_p + 1;
  }
  for (local_480 = 1;
      local_480 <
      (int)(((long)local_448->m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_448->m_access[0].
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28); local_480 = local_480 + 1) {
    uVar4 = 0;
    while( true ) {
      pvVar1 = local_458;
      poVar5 = &local_1b0.m_str;
      if (5 < (int)uVar4) break;
      local_470 = (Vec4 *)compareGenMipmapResult::s_faceNames[uVar4];
      local_464 = uVar4;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&src,&local_458[uVar4].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_480 + -1].
                       super_ConstPixelBufferAccess);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&dst,&pvVar1[uVar4].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_480].
                       super_ConstPixelBufferAccess);
      tcu::Surface::Surface(&errorMask,dst.m_size.m_data[0],dst.m_size.m_data[1]);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
      precision_00 = local_450;
      iVar3 = compareGenMipmapBilinear(&dst,&src,(PixelBufferAccess *)&local_1b0,local_450);
      local_460 = (BVec4 *)CONCAT44(local_460._4_4_,
                                    (int)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1));
      if (iVar3 != 0) {
        this = &local_1b0.m_str;
        local_1b0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,"WARNING: Level ");
        std::ostream::operator<<(this,local_480);
        std::operator<<((ostream *)this,", face ");
        std::operator<<((ostream *)this,(char *)local_470);
        std::operator<<((ostream *)this," comparison to bilinear method failed, found ");
        std::ostream::operator<<(this,iVar3);
        std::operator<<((ostream *)this," invalid pixels.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
        precision_00 = local_450;
        iVar3 = compareGenMipmapBox(&dst,&src,(PixelBufferAccess *)&local_1b0,local_450);
        if (iVar3 != 0) {
          local_1b0.m_log = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar5);
          std::operator<<((ostream *)poVar5,"WARNING: Level ");
          std::ostream::operator<<(poVar5,local_480);
          std::operator<<((ostream *)poVar5,", face ");
          std::operator<<((ostream *)poVar5,(char *)local_470);
          std::operator<<((ostream *)poVar5," comparison to box method failed, found ");
          std::ostream::operator<<(poVar5,iVar3);
          std::operator<<((ostream *)poVar5," invalid pixels.");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar5);
          precision_00 = (GenMipmapPrecision *)0x2;
          if (local_47c == QP_TEST_RESULT_PASS) {
            local_47c = QP_TEST_RESULT_QUALITY_WARNING;
          }
          tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
          iVar3 = compareGenMipmapVeryLenient
                            (&dst,&src,(PixelBufferAccess *)&local_1b0,precision_00);
          poVar5 = &local_1b0.m_str;
          if (iVar3 != 0) {
            local_1b0.m_log = log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar5);
            std::operator<<((ostream *)poVar5,"ERROR: Level ");
            std::ostream::operator<<(poVar5,local_480);
            std::operator<<((ostream *)poVar5,", face ");
            std::operator<<((ostream *)poVar5,(char *)local_470);
            std::operator<<((ostream *)poVar5," appears to contain ");
            std::ostream::operator<<(poVar5,iVar3);
            std::operator<<((ostream *)poVar5," completely wrong pixels, failing case!");
            tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar5);
            local_460 = (BVec4 *)((ulong)local_460 & 0xffffffff00000000);
            local_47c = QP_TEST_RESULT_FAIL;
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Level",&local_471);
      de::toString<int>(&local_250,&local_480);
      std::operator+(&local_390,&local_310,&local_250);
      std::operator+(&local_438,&local_390,"Face");
      de::toString<int>(&local_270,(int *)&local_464);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threshold
                     ,&local_438,&local_270);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"Level ",&local_472);
      de::toString<int>(&local_2d0,&local_480);
      std::operator+(&local_2b0,&local_350,&local_2d0);
      std::operator+(&local_330,&local_2b0,", face ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,(char *)local_470,&local_473);
      std::operator+(&local_290,&local_330,&local_2f0);
      std::operator+(&local_1d0,&local_290," result");
      tcu::LogImageSet::LogImageSet(&local_230,(string *)&threshold,&local_1d0);
      iVar3 = (int)log;
      tcu::LogImageSet::write(&local_230,iVar3,__buf,(size_t)precision_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"Result",&local_474);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Result",&local_475);
      access = &dst;
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_370,&local_1f0,access,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)&local_1b0,iVar3,__buf_00,(size_t)access);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_370);
      tcu::LogImageSet::~LogImageSet(&local_230);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&threshold);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_310);
      if ((char)local_460 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"ErrorMask",(allocator<char> *)&local_438);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&threshold,"Error mask",(allocator<char> *)&local_390);
        surface = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&local_1b0,&local_230.m_name,(string *)&threshold,surface,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&local_1b0,iVar3,__buf_01,(size_t)surface);
        tcu::LogImage::~LogImage((LogImage *)&local_1b0);
        std::__cxx11::string::~string((string *)&threshold);
        std::__cxx11::string::~string((string *)&local_230);
      }
      tcu::TestLog::endImageSet(log);
      tcu::Surface::~Surface(&errorMask);
      uVar4 = local_464 + 1;
    }
  }
  return local_47c;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::TextureCube& resultTexture, const tcu::TextureCube& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	static const char* s_faceNames[] = { "-X", "+X", "-Y", "+Y", "-Z", "+Z" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_faceNames) == tcu::CUBEFACE_LAST);

	// Special comparison for level 0.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace	face		= tcu::CubeFace(faceNdx);
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log,
																	 ("Level0Face" + de::toString(faceNdx)).c_str(),
																	 (string("Level 0, face ") + s_faceNames[face]).c_str(),
																	 level0Reference.getLevelFace(0, face),
																	 resultTexture.getLevelFace(0, face),
																	 threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0, face " << s_faceNames[face] << " comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace					face		= tcu::CubeFace(faceNdx);
			const char*							faceName	= s_faceNames[face];
			const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevelFace(levelNdx-1,	face);
			const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevelFace(levelNdx,		face);
			tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
			bool								levelOk		= false;

			// Try different comparisons in quality order.

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName <<" comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			// At this point all high-quality methods have been used.
			if (!levelOk && result == QP_TEST_RESULT_PASS)
				result = QP_TEST_RESULT_QUALITY_WARNING;

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << ", face " << faceName << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
				result = QP_TEST_RESULT_FAIL;

			log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx) + "Face" + de::toString(faceNdx), string("Level ") + de::toString(levelNdx) + ", face " + string(faceName) + " result")
				<< tcu::TestLog::Image("Result", "Result", dst);

			if (!levelOk)
				log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

			log << tcu::TestLog::EndImageSet;
		}
	}

	return result;
}